

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O2

MaxHeap * __thiscall
hnsw::HNSWIndex::SearchLayer
          (MaxHeap *__return_storage_ptr__,HNSWIndex *this,float *q,Point *ep,uint32_t ef,
          uint32_t layer)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  uint uVar1;
  long lVar2;
  uint *puVar3;
  pointer ppVar4;
  bool bVar5;
  Point *neighbor;
  uint *puVar6;
  ulong __n;
  float fVar7;
  float dist;
  long local_68;
  long local_60;
  MinHeap candidates;
  
  (__return_storage_ptr__->super_MaxHeapImpl).c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  candidates.super_MinHeapImpl.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->visited_;
  (__return_storage_ptr__->super_MaxHeapImpl).c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_MaxHeapImpl).c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  candidates.super_MinHeapImpl.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  candidates.super_MinHeapImpl.c.
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(this_00);
  __n = (ulong)ef;
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  reserve((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           *)__return_storage_ptr__,__n);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
            (this_00,(ulong)ep->first,true);
  std::
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
  ::push(&candidates.super_MinHeapImpl,ep);
  std::
  priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
  ::push(&__return_storage_ptr__->super_MaxHeapImpl,ep);
  local_60 = (ulong)layer * 0x18;
  while (candidates.super_MinHeapImpl.c.
         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         candidates.super_MinHeapImpl.c.
         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    uVar1 = (candidates.super_MinHeapImpl.c.
             super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->first;
    local_68 = CONCAT44(local_68._4_4_,
                        (candidates.super_MinHeapImpl.c.
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->second);
    std::
    priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointGreaterComparator>
    ::pop(&candidates.super_MinHeapImpl);
    if (((__return_storage_ptr__->super_MaxHeapImpl).c.
         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->second < (float)local_68) break;
    lVar2 = *(long *)&(this->vertices_).
                      super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar1].neighbors.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl;
    puVar3 = *(uint **)(lVar2 + 8 + local_60);
    fVar7 = (float)local_68;
    local_68 = (ulong)uVar1 * 0x20;
    for (puVar6 = *(uint **)(lVar2 + local_60); puVar6 != puVar3; puVar6 = puVar6 + 2) {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                (this_00,(ulong)*puVar6);
    }
    lVar2 = *(long *)((long)&(((this->vertices_).
                               super__Vector_base<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                               ._M_impl.super__Vector_impl_data._M_start)->neighbors).
                             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_68);
    puVar3 = *(uint **)(lVar2 + 8 + local_60);
    for (puVar6 = *(uint **)(lVar2 + local_60); puVar6 != puVar3; puVar6 = puVar6 + 2) {
      bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                        (this_00,(ulong)*puVar6);
      if (!bVar5) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                  (this_00,(ulong)*puVar6,true);
        (**this->distance_->_vptr_Distance)
                  (this->distance_,
                   (this->points_).row_ptrs_.
                   super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                   super__Vector_impl_data._M_start[*puVar6],q);
        ppVar4 = (__return_storage_ptr__->super_MaxHeapImpl).c.
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dist = fVar7;
        if (((ulong)((long)(__return_storage_ptr__->super_MaxHeapImpl).c.
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 >> 3) < __n) ||
           (fVar7 < ppVar4->second)) {
          std::
          priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointGreaterComparator>
          ::emplace<unsigned_int_const&,float&>
                    ((priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointGreaterComparator>
                      *)&candidates,puVar6,&dist);
          std::
          priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
          ::emplace<unsigned_int_const&,float&>
                    ((priority_queue<std::pair<unsigned_int,float>,std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,hnsw::PointLessComparator>
                      *)__return_storage_ptr__,puVar6,&dist);
          if (__n < (ulong)((long)(__return_storage_ptr__->super_MaxHeapImpl).c.
                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(__return_storage_ptr__->super_MaxHeapImpl).c.
                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3)) {
            std::
            priority_queue<std::pair<unsigned_int,_float>,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_hnsw::PointLessComparator>
            ::pop(&__return_storage_ptr__->super_MaxHeapImpl);
          }
        }
      }
    }
  }
  std::
  _Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  ~_Vector_base((_Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 *)&candidates);
  return __return_storage_ptr__;
}

Assistant:

MaxHeap SearchLayer(const float *q, const Point &ep, uint32_t ef, uint32_t layer) {
    MaxHeap result;      // max heap
    MinHeap candidates;  // min heap
    visited_.reset();
    result.Container().reserve(ef);

    visited_.set(ep.first);
    candidates.push(ep);
    result.push(ep);

    while (!candidates.empty()) {
      Point p = candidates.top();
      candidates.pop();

      if (p.second > result.top().second) {
        break;
      }

#ifdef PREFETCH_DATA
      // prefetech into cache
      for (const Point &neighbor : vertices_[p.first].neighbors[layer]) {
        if (!visited_.test(neighbor.first)) {
          _mm_prefetch(points_[neighbor.first], _MM_HINT_T0);
        }
      }
#endif

      for (const Point &neighbor : vertices_[p.first].neighbors[layer]) {
        const index_t &edge = neighbor.first;
        if (visited_.test(neighbor.first)) {
          continue;
        }
        visited_.set(edge);
        float dist = distance_(points_[edge], q);
        if (result.size() < ef || dist < result.top().second) {
          candidates.emplace(edge, dist);
          result.emplace(edge, dist);
          if (result.size() > ef) {
            result.pop();
          }
        }
      }
    }

    return result;
  }